

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O3

string_char lsvm::string::next(iterator *it)

{
  byte bVar1;
  uint32_t uVar2;
  string *psVar3;
  long lVar4;
  uint32_t uVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  
  psVar3 = it->s;
  uVar2 = psVar3->size;
  uVar5 = it->p;
  if ((int)uVar5 < (int)uVar2) {
    uVar5 = uVar5 + 1;
    it->p = uVar5;
  }
  uVar6 = 0;
  if (uVar2 != uVar5) {
    lVar8 = (long)(int)uVar5;
    bVar1 = *(byte *)((long)&psVar3[1].count + lVar8);
    uVar6 = (uint)bVar1;
    if (-1 < (char)bVar1) {
      return uVar6;
    }
    if (bVar1 < 0xe0) {
      uVar6 = (uVar6 & 0x1f) << 6;
      iVar7 = 1;
      lVar4 = 1;
    }
    else if (bVar1 < 0xf0) {
      uVar6 = (*(byte *)((long)&psVar3[1].count + lVar8 + 1) & 0x3f | (uVar6 & 0xf) << 6) << 6;
      iVar7 = 2;
      lVar4 = 2;
    }
    else {
      if (0xf4 < bVar1) {
        return 0;
      }
      uVar6 = (*(byte *)((long)&psVar3[1].count + lVar8 + 2) & 0x3f) << 6 |
              (*(byte *)((long)&psVar3[1].count + lVar8 + 1) & 0x3f | (uVar6 & 7) << 6) << 0xc;
      iVar7 = 3;
      lVar4 = 3;
    }
    uVar6 = *(byte *)((long)&psVar3[1].count + lVar4 + lVar8) & 0x3f | uVar6;
    it->p = uVar5 + iVar7;
  }
  return uVar6;
}

Assistant:

string_char next(iterator* it){
    string_char sc = 0;    
    if((int32_t)it->s->size > it->p)
        it->p += 1;
    if((int32_t)it->s->size == it->p)
        return null;

    uint8_t* s = reinterpret_cast<uint8_t*>(it->s+1);
    s += it->p;
    
    if (*s < 0x80) {
        sc = (*s & 0x7F);
    } else if (*s < 0xE0) {
        sc = (*s & 0x1F);
        sc <<= 6;
        sc |= (*(s+1) & 0x3F);
        it->p += 1;
    } else if (*s < 0xF0) {
        sc = (*s & 0xF);
        sc <<= 6;
        sc |= (*(s+1) & 0x3F);
        sc <<= 6;
        sc |= (*(s+2) & 0x3F);
        it->p += 2;
    } else if (*s < 0xF5) {
        sc = (*s & 0x7);
        sc <<= 6;
        sc |= (*(s+1) & 0x3F);
        sc <<= 6;
        sc |= (*(s+2) & 0x3F);
        sc <<= 6;
        sc |= (*(s+3) & 0x3F);
        it->p += 3;
    }

    return sc;
}